

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference
               (IfcExtrudedAreaSolid *as,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  allocator<Assimp::IFC::TempOpening> *this;
  double dVar1;
  IfcVector3 extrusionDir;
  bool bVar2;
  TempMesh *this_00;
  element_type *result_00;
  reference puVar3;
  aiVector3t<double> local_1e8;
  allocator<aiVector3t<double>_> local_1c9;
  aiVector3t<double> local_1c8;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> local_1b0;
  IfcVector3 local_198;
  aiVector3t<double> *local_180;
  IfcVector3 *normal;
  aiVector3t<double> *local_170;
  __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_168;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_160;
  const_iterator local_158;
  uint local_14c;
  const_iterator cStack_148;
  uint pcount;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  const_iterator vit;
  TempMesh temp;
  shared_ptr<Assimp::IFC::TempMesh> local_f0;
  shared_ptr<Assimp::IFC::TempMesh> local_e0;
  aiVector3t<double> local_d0;
  TempOpening local_b8;
  undefined1 local_60 [8];
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> openings;
  undefined1 local_38 [8];
  shared_ptr<Assimp::IFC::TempMesh> meshtmp;
  ConversionData *conv_local;
  TempMesh *first_operand_local;
  TempMesh *result_local;
  IfcExtrudedAreaSolid *as_local;
  
  meshtmp.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)conv;
  if (as != (IfcExtrudedAreaSolid *)0x0) {
    this_00 = (TempMesh *)operator_new(0x30);
    (this_00->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TempMesh::TempMesh(this_00);
    std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr<Assimp::IFC::TempMesh,void>
              ((shared_ptr<Assimp::IFC::TempMesh> *)local_38,this_00);
    result_00 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator*((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
    ProcessExtrudedAreaSolid
              (as,result_00,
               (ConversionData *)
               meshtmp.super___shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi,false);
    aiVector3t<double>::aiVector3t(&local_d0,0.0,0.0,0.0);
    std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr
              (&local_e0,(shared_ptr<Assimp::IFC::TempMesh> *)local_38);
    std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr(&local_f0);
    extrusionDir.y = local_d0.y;
    extrusionDir.x = local_d0.x;
    extrusionDir.z = local_d0.z;
    TempOpening::TempOpening(&local_b8,(IfcSolidModel *)as,extrusionDir,&local_e0,&local_f0);
    this = (allocator<Assimp::IFC::TempOpening> *)
           ((long)&temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<Assimp::IFC::TempOpening>::allocator(this);
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::vector
              ((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               local_60,1,&local_b8,this);
    std::allocator<Assimp::IFC::TempOpening>::~allocator
              ((allocator<Assimp::IFC::TempOpening> *)
               ((long)&temp.mVertcnt.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    TempOpening::~TempOpening(&local_b8);
    std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr(&local_f0);
    std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr(&local_e0);
    TempMesh::operator=(result,first_operand);
    TempMesh::TempMesh((TempMesh *)&vit);
    __range2 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                         (&first_operand->mVerts);
    __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       (&first_operand->mVertcnt);
    cStack_148 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           (&first_operand->mVertcnt);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffeb8);
      if (!bVar2) break;
      puVar3 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
      local_14c = *puVar3;
      TempMesh::Clear((TempMesh *)&vit);
      local_160._M_current =
           (aiVector3t<double> *)
           std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                     ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&vit);
      __gnu_cxx::
      __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
      ::__normal_iterator<aiVector3t<double>*>
                ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                  *)&local_158,&local_160);
      local_168._M_current = (aiVector3t<double> *)__range2;
      local_170 = (aiVector3t<double> *)
                  __gnu_cxx::
                  __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                  ::operator+((__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                               *)&__range2,(ulong)local_14c);
      normal = (IfcVector3 *)
               std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
               insert<__gnu_cxx::__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                         ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)&vit,
                          local_158,local_168,
                          (__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                           )local_170);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &temp.mVerts.
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_14c);
      TempMesh::ComputeLastPolygonNormal(&local_198,(TempMesh *)&vit,false);
      local_180 = &local_198;
      dVar1 = aiVector3t<double>::SquareLength(local_180);
      if (1e-05 <= dVar1) {
        aiVector3t<double>::aiVector3t(&local_1c8,1.0,0.0,0.0);
        std::allocator<aiVector3t<double>_>::allocator(&local_1c9);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                  (&local_1b0,1,&local_1c8,&local_1c9);
        aiVector3t<double>::aiVector3t(&local_1e8,0.0,1.0,0.0);
        GenerateOpenings((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                          *)local_60,&local_1b0,(TempMesh *)&vit,false,true,&local_1e8);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector(&local_1b0);
        std::allocator<aiVector3t<double>_>::~allocator(&local_1c9);
        TempMesh::Append(result,(TempMesh *)&vit);
        __gnu_cxx::
        __normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
        ::operator+=((__normal_iterator<const_aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                      *)&__range2,(ulong)local_14c);
      }
      else {
        LogFunctions<Assimp::IFCImporter>::LogWarn
                  ("skipping degenerate polygon (ProcessBooleanExtrudedAreaSolidDifference)");
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&__end2);
    }
    LogFunctions<Assimp::IFCImporter>::LogDebug
              ("generating CSG geometry by geometric difference to a solid (IfcExtrudedAreaSolid)");
    TempMesh::~TempMesh((TempMesh *)&vit);
    std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::~vector
              ((vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               local_60);
    std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr
              ((shared_ptr<Assimp::IFC::TempMesh> *)local_38);
    return;
  }
  __assert_fail("as != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCBoolean.cpp"
                ,0x2d3,
                "void Assimp::IFC::ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid *, TempMesh &, const TempMesh &, ConversionData &)"
               );
}

Assistant:

void ProcessBooleanExtrudedAreaSolidDifference(const Schema_2x3::IfcExtrudedAreaSolid* as, TempMesh& result,
                                               const TempMesh& first_operand,
                                               ConversionData& conv)
{
    ai_assert(as != NULL);

    // This case is handled by reduction to an instance of the quadrify() algorithm.
    // Obviously, this won't work for arbitrarily complex cases. In fact, the first
    // operand should be near-planar. Luckily, this is usually the case in Ifc
    // buildings.

    std::shared_ptr<TempMesh> meshtmp = std::shared_ptr<TempMesh>(new TempMesh());
    ProcessExtrudedAreaSolid(*as,*meshtmp,conv,false);

    std::vector<TempOpening> openings(1, TempOpening(as,IfcVector3(0,0,0),meshtmp,std::shared_ptr<TempMesh>()));

    result = first_operand;

    TempMesh temp;

    std::vector<IfcVector3>::const_iterator vit = first_operand.mVerts.begin();
    for(unsigned int pcount : first_operand.mVertcnt) {
        temp.Clear();

        temp.mVerts.insert(temp.mVerts.end(), vit, vit + pcount);
        temp.mVertcnt.push_back(pcount);

        // The algorithms used to generate mesh geometry sometimes
        // spit out lines or other degenerates which must be
        // filtered to avoid running into assertions later on.

        // ComputePolygonNormal returns the Newell normal, so the
        // length of the normal is the area of the polygon.
        const IfcVector3& normal = temp.ComputeLastPolygonNormal(false);
        if (normal.SquareLength() < static_cast<IfcFloat>(1e-5)) {
            IFCImporter::LogWarn("skipping degenerate polygon (ProcessBooleanExtrudedAreaSolidDifference)");
            continue;
        }

        GenerateOpenings(openings, std::vector<IfcVector3>(1,IfcVector3(1,0,0)), temp, false, true);
        result.Append(temp);

        vit += pcount;
    }

    IFCImporter::LogDebug("generating CSG geometry by geometric difference to a solid (IfcExtrudedAreaSolid)");
}